

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdSerializeByteData(void *handle,char *buffer,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  undefined1 local_78 [32];
  ByteData data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  if (buffer == (char *)0x0) {
    local_78._0_8_ = "cfdcapi_common.cpp";
    local_78._8_4_ = 0x2b3;
    local_78._16_8_ = "CfdSerializeByteData";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"buffer is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to parameter. buffer is null.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output != (char **)0x0) {
    std::__cxx11::string::string((string *)local_78,buffer,(allocator *)&local_40);
    cfd::core::ByteData::ByteData(&data,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    cfd::core::ByteData::Serialize((ByteData *)&local_40,&data);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_78,(ByteData *)&local_40);
    pcVar1 = cfd::capi::CreateString((string *)local_78);
    *output = pcVar1;
    std::__cxx11::string::~string((string *)local_78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    return 0;
  }
  local_78._0_8_ = "cfdcapi_common.cpp";
  local_78._8_4_ = 0x2b9;
  local_78._16_8_ = "CfdSerializeByteData";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"output is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to parameter. output is null.",(allocator *)&data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSerializeByteData(
    void* handle, const char* buffer, char** output) {
  try {
    cfd::Initialize();
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }

    ByteData data(buffer);
    *output = cfd::capi::CreateString(data.Serialize().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}